

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_subi_16_d(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  uint uVar4;
  
  uVar1 = m68ki_cpu.ir;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  uVar3 = m68ki_cpu.dar[uVar1 & 7] & 0xffff;
  uVar4 = uVar3 - uVar2;
  m68ki_cpu.x_flag = uVar4 >> 8;
  m68ki_cpu.not_z_flag = uVar4 & 0xffff;
  m68ki_cpu.v_flag = ((uVar4 ^ uVar3) & (uVar2 ^ uVar3)) >> 8;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_cpu.dar[uVar1 & 7] = m68ki_cpu.dar[uVar1 & 7] & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_subi_16_d(void)
{
	uint* r_dst = &DY;
	uint src = OPER_I_16();
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}